

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.c
# Opt level: O0

int CpuFeatures_StringView_ParsePositiveNumber(StringView view)

{
  StringView view_00;
  _Bool _Var1;
  int iVar2;
  long in_RSI;
  undefined8 in_RDI;
  StringView SVar3;
  StringView span_no_prefix;
  StringView hex_prefix;
  StringView in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  if (in_RSI == 0) {
    iVar2 = -1;
  }
  else {
    SVar3 = str((char *)in_stack_ffffffffffffffc8.size);
    _Var1 = CpuFeatures_StringView_StartsWith(SVar3,in_stack_ffffffffffffffc8);
    if (_Var1) {
      CpuFeatures_StringView_PopFront(in_stack_ffffffffffffffc8,0x107e83);
      SVar3.size._0_4_ = in_stack_fffffffffffffff8;
      SVar3.ptr = (char *)in_RSI;
      SVar3.size._4_4_ = in_stack_fffffffffffffffc;
      iVar2 = ParsePositiveNumberWithBase(SVar3,iVar2);
    }
    else {
      view_00.size._0_4_ = in_stack_fffffffffffffff8;
      view_00.ptr = (char *)in_RSI;
      view_00.size._4_4_ = in_stack_fffffffffffffffc;
      iVar2 = ParsePositiveNumberWithBase(view_00,iVar2);
    }
  }
  return iVar2;
}

Assistant:

int CpuFeatures_StringView_ParsePositiveNumber(const StringView view) {
  if (view.size) {
    const StringView hex_prefix = str("0x");
    if (CpuFeatures_StringView_StartsWith(view, hex_prefix)) {
      const StringView span_no_prefix =
          CpuFeatures_StringView_PopFront(view, hex_prefix.size);
      return ParsePositiveNumberWithBase(span_no_prefix, 16);
    }
    return ParsePositiveNumberWithBase(view, 10);
  }
  return -1;
}